

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O2

string * __thiscall Interval::dump_abi_cxx11_(string *__return_storage_ptr__,Interval *this)

{
  Datetime *pDVar1;
  ostream *poVar2;
  time_t tVar3;
  _Base_ptr p_Var4;
  string local_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  std::operator<<(local_1a8,"interval");
  if (this->id != 0) {
    poVar2 = std::operator<<(local_1a8," @");
    std::ostream::operator<<(poVar2,this->id);
  }
  pDVar1 = &(this->super_Range).start;
  tVar3 = Datetime::toEpoch(pDVar1);
  if (tVar3 != 0) {
    poVar2 = std::operator<<(local_1a8," ");
    Datetime::toISOLocalExtended_abi_cxx11_(&local_1d8,pDVar1);
    std::operator<<(poVar2,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  pDVar1 = &(this->super_Range).end;
  tVar3 = Datetime::toEpoch(pDVar1);
  if (tVar3 != 0) {
    poVar2 = std::operator<<(local_1a8," - ");
    Datetime::toISOLocalExtended_abi_cxx11_(&local_1d8,pDVar1);
    std::operator<<(poVar2,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  if ((this->_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(local_1a8," #");
    for (p_Var4 = (this->_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->_tags)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar2 = std::operator<<(local_1a8,' ');
      quoteIfNeeded(&local_1d8,(string *)(p_Var4 + 1));
      std::operator<<(poVar2,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  if (this->synthetic == true) {
    std::operator<<(local_1a8," synthetic");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Interval::dump () const
{
  std::stringstream out;

  out << "interval";

  if (id)
    out << " @" << id;

  if (start.toEpoch ())
    out << " " << start.toISOLocalExtended ();

  if (end.toEpoch ())
    out << " - " << end.toISOLocalExtended ();

  if (! _tags.empty ())
  {
    out << " #";
    for (auto& tag : _tags)
      out << ' ' << quoteIfNeeded (tag);
  }

  if (synthetic)
    out << " synthetic";

  return out.str ();
}